

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O1

bool __thiscall
jaegertracing::thrift::DependencyProcessor::dispatchCall
          (DependencyProcessor *this,TProtocol *iprot,TProtocol *oprot,string *fname,int32_t seqid,
          void *callContext)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  iterator iVar3;
  long *plVar4;
  size_type *psVar5;
  ulong __n;
  void *__buf;
  code *pcVar6;
  TApplicationException x;
  string local_a0;
  TApplicationException local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = (ulong)(uint)seqid;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
          ::find(&(this->processMap_)._M_t,fname);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->processMap_)._M_t._M_impl.super__Rb_tree_header) {
    (*iprot->_vptr_TProtocol[0x2c])(iprot,0xc);
    (*iprot->_vptr_TProtocol[0x18])(iprot);
    peVar1 = (iprot->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (iprot->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_TTransport[8])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    std::operator+(&local_50,"Invalid method name: \'",fname);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0.field_2._8_8_ = plVar4[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_a0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    apache::thrift::TException::TException(&local_80.super_TException,&local_a0);
    local_80.super_TException._0_8_ = &PTR__TException_00276740;
    local_80.type_ = UNKNOWN_METHOD;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    (*oprot->_vptr_TProtocol[2])(oprot,fname,3);
    apache::thrift::TApplicationException::write(&local_80,(int)oprot,__buf,__n);
    (*oprot->_vptr_TProtocol[3])(oprot);
    peVar1 = (oprot->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (oprot->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_TTransport[10])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar1 = (oprot->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (oprot->ptrans_).
             super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_TTransport[0xb])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    apache::thrift::TException::~TException(&local_80.super_TException);
  }
  else {
    pcVar6 = *(code **)(iVar3._M_node + 2);
    plVar4 = (long *)((long)&(iVar3._M_node[2]._M_parent)->_M_color +
                     (long)&this->super_TDispatchProcessor);
    if (((ulong)pcVar6 & 1) != 0) {
      pcVar6 = *(code **)(pcVar6 + *plVar4 + -1);
    }
    (*pcVar6)(plVar4,__n,iprot,oprot,callContext);
  }
  return true;
}

Assistant:

bool DependencyProcessor::dispatchCall(::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot, const std::string& fname, int32_t seqid, void* callContext) {
  ProcessMap::iterator pfn;
  pfn = processMap_.find(fname);
  if (pfn == processMap_.end()) {
    iprot->skip(::apache::thrift::protocol::T_STRUCT);
    iprot->readMessageEnd();
    iprot->getTransport()->readEnd();
    ::apache::thrift::TApplicationException x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, "Invalid method name: '"+fname+"'");
    oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);
    x.write(oprot);
    oprot->writeMessageEnd();
    oprot->getTransport()->writeEnd();
    oprot->getTransport()->flush();
    return true;
  }
  (this->*(pfn->second))(seqid, iprot, oprot, callContext);
  return true;
}